

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpd.cpp
# Opt level: O1

int main(void)

{
  undefined1 *puVar1;
  HttpServer httpd;
  EventLoopGroup group;
  undefined1 auStack_178 [16];
  undefined1 local_168 [48];
  _Any_data local_138;
  pointer local_128;
  code *local_120;
  EventLoop **local_118 [2];
  EventLoop *local_108 [2];
  string local_f8;
  string local_d8;
  EventLoopGroup local_b8;
  
  puVar1 = local_168 + 0x10;
  local_168._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"EPOLL","");
  Liby::EventLoopGroup::EventLoopGroup(&local_b8,0,(string *)local_168);
  if ((undefined1 *)local_168._0_8_ != puVar1) {
    operator_delete((void *)local_168._0_8_);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/home/ccsexyz","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"localhost","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"8080","");
  Liby::EventLoopGroup::creatTcpServer((EventLoopGroup *)auStack_178,(string *)&local_b8,&local_f8);
  Liby::http::HttpServer::HttpServer
            ((HttpServer *)local_168,&local_d8,(shared_ptr<Liby::TcpServer> *)auStack_178);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_178._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_178._8_8_);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_120 = std::
              _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
              ::_M_invoke;
  local_128 = (pointer)std::
                       _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
                       ::_M_manager;
  Liby::EventLoopGroup::run(&local_b8,(BoolFunctor *)&local_138);
  if (local_128 != (pointer)0x0) {
    (*(code *)local_128)(&local_138,&local_138,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._40_8_);
  }
  if ((undefined1 *)local_168._0_8_ != puVar1) {
    operator_delete((void *)local_168._0_8_);
  }
  Liby::EventLoopGroup::~EventLoopGroup(&local_b8);
  return 0;
}

Assistant:

int main(void) {
    EventLoopGroup group;
    HttpServer httpd("/home/ccsexyz",
                     group.creatTcpServer("localhost", "8080"));
    group.run();
    return 0;
}